

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_imheader(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int *in_RDX;
  fitsfile *in_RSI;
  int *in_RDI;
  char card [81];
  int keyclass;
  int ii;
  int nkeys;
  char *in_stack_00000368;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  char *in_stack_ffffffffffffff80;
  fitsfile *in_stack_ffffffffffffff88;
  int iVar2;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDX < 1) {
    ffghsp((fitsfile *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
           (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
           (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(int *)0x2003d4);
    for (iVar2 = 5; iVar2 <= in_stack_ffffffffffffffdc; iVar2 = iVar2 + 1) {
      ffgrec((fitsfile *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff74,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(int *)0x200405);
      iVar1 = ffgkcl(in_stack_00000368);
      if ((0x14 < iVar1) && (iVar1 != 100)) {
        if (in_stack_ffffffffffffff78 < 'D') {
          in_stack_ffffffffffffff74 = -1;
        }
        else if (in_stack_ffffffffffffff78 < 'E') {
          in_stack_ffffffffffffff70 = strncmp(&stack0xffffffffffffff78,"DATE ",5);
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70;
        }
        else {
          in_stack_ffffffffffffff70 = 1;
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70;
        }
        if (in_stack_ffffffffffffff74 == 0) {
          ffpdat((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
        }
        else {
          if (in_stack_ffffffffffffff78 < 'E') {
            in_stack_ffffffffffffff6c = -1;
          }
          else if (in_stack_ffffffffffffff78 < 'F') {
            in_stack_ffffffffffffff68 = strncmp(&stack0xffffffffffffff78,"EXTNAME ",8);
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68;
          }
          else {
            in_stack_ffffffffffffff68 = 1;
            in_stack_ffffffffffffff6c = in_stack_ffffffffffffff68;
          }
          if (in_stack_ffffffffffffff6c == 0) {
            if (((in_stack_ffffffffffffff78 < 'E') || ('E' < in_stack_ffffffffffffff78)) ||
               (iVar1 = strncmp(&stack0xffffffffffffff78,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c),
               iVar1 != 0)) {
              ffucrd(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     (char *)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                     (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            }
          }
          else {
            ffprec(in_RSI,(char *)in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffdc,iVar2));
          }
        }
        if (0 < *in_RDX) {
          return *in_RDX;
        }
      }
    }
    iVar2 = *in_RDX;
  }
  else {
    iVar2 = *in_RDX;
  }
  return iVar2;
}

Assistant:

int imcomp_copy_imheader(fitsfile *infptr, fitsfile *outfptr, int *status)
/*
    This routine reads the header keywords from the input image and
    copies them to the output image;  the manditory structural keywords
    and the checksum keywords are not copied. If the DATE keyword is copied,
    then it is updated with the current date and time.
*/
{
    int nkeys, ii, keyclass;
    char card[FLEN_CARD];	/* a header record */

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, NULL, status); /* get number of keywords in image */

    for (ii = 5; ii <= nkeys; ii++)  /* skip the first 4 keywords */
    {
        ffgrec(infptr, ii, card, status);

	keyclass = ffgkcl(card);  /* Get the type/class of keyword */

        /* don't copy structural keywords or checksum keywords */
        if ((keyclass <= TYP_CMPRS_KEY) || (keyclass == TYP_CKSUM_KEY))
	    continue;

        if (FSTRNCMP(card, "DATE ", 5) == 0) /* write current date */
        {
            ffpdat(outfptr, status);
        }
        else if (FSTRNCMP(card, "EXTNAME ", 8) == 0) 
        {
            /* don't copy default EXTNAME keyword from a compressed image */
            if (FSTRNCMP(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28))
            {
                /* if EXTNAME keyword already exists, overwrite it */
                /* otherwise append a new EXTNAME keyword */
                ffucrd(outfptr, "EXTNAME", card, status);
            }
        }
        else
        {
            /* just copy the keyword to the output header */
	    ffprec (outfptr, card, status);
        }

        if (*status > 0)
           return (*status);
    }
    return (*status);
}